

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcolsetbase.h
# Opt level: O3

void __thiscall
soplex::LPColSetBase<double>::LPColSetBase(LPColSetBase<double> *this,LPColSetBase<double> *rs)

{
  SVSetBase<double>::SVSetBase(&this->super_SVSetBase<double>,&rs->super_SVSetBase<double>);
  (this->super_SVSetBase<double>).super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray =
       (_func_int **)&PTR__LPColSetBase_003af6f8;
  std::vector<double,_std::allocator<double>_>::vector(&(this->low).val,&(rs->low).val);
  std::vector<double,_std::allocator<double>_>::vector(&(this->up).val,&(rs->up).val);
  std::vector<double,_std::allocator<double>_>::vector(&(this->object).val,&(rs->object).val);
  DataArray<int>::DataArray(&this->scaleExp,&rs->scaleExp);
  return;
}

Assistant:

LPColSetBase(const LPColSetBase<R>& rs)
      : SVSetBase<R>(rs)
      , low(rs.low)
      , up(rs.up)
      , object(rs.object)
      , scaleExp(rs.scaleExp)
   {
      assert(isConsistent());
   }